

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_fold.c
# Opt level: O0

void emit_fold(BuildCtx *ctx)

{
  FILE *__stream;
  FILE *pFVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  size_t sVar5;
  char *q;
  char *p;
  FILE *fp;
  char *fname;
  char buf [256];
  BuildCtx *ctx_local;
  
  fp = (FILE *)*ctx->args;
  if (fp == (FILE *)0x0) {
    fprintf(_stderr,"Error: missing input filename\n");
    exit(1);
  }
  if (((char)fp->_flags == '-') && (*(char *)((long)&fp->_flags + 1) == '\0')) {
    p = _stdin;
  }
  else {
    p = (char *)fopen((char *)fp,"r");
    pFVar1 = fp;
    __stream = _stderr;
    if ((FILE *)p == (FILE *)0x0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fprintf(__stream,"Error: cannot open input file \'%s\': %s\n",pFVar1,pcVar4);
      exit(1);
    }
  }
  fprintf((FILE *)ctx->fp,"/* This is a generated file. DO NOT EDIT! */\n\n");
  fprintf((FILE *)ctx->fp,"static const FoldFunc fold_func[] = {\n");
  lineno = 0;
  funcidx = 0;
  nkeys = 0;
  while( true ) {
    while( true ) {
      do {
        pcVar4 = fgets((char *)&fname,0x100,(FILE *)p);
        if (pcVar4 == (char *)0x0) {
          fclose((FILE *)p);
          fprintf((FILE *)ctx->fp,"\n};\n\n");
          makehash(ctx);
          return;
        }
        lineno = lineno + 1;
        iVar2 = strncmp((char *)&fname,"LJFOLD",6);
      } while (iVar2 != 0);
      pcVar4 = strchr((char *)((long)&fname + 6),0x29);
      if ((fname._6_1_ != '(') || (pcVar4 == (char *)0x0)) break;
      *pcVar4 = '\0';
      foldrule((char *)((long)&fname + 7));
    }
    if (((fname._6_1_ != 'F') && (fname._6_1_ != 'X')) ||
       ((fname._7_1_ != '(' || (pcVar4 == (char *)0x0)))) break;
    *pcVar4 = '\0';
    if (funcidx != 0) {
      fprintf((FILE *)ctx->fp,",\n");
    }
    if (fname._6_1_ == 'X') {
      fprintf((FILE *)ctx->fp,"  %s",buf);
    }
    else {
      fprintf((FILE *)ctx->fp,"  fold_%s",buf);
    }
    funcidx = funcidx + 1;
  }
  sVar5 = strlen((char *)&fname);
  *(undefined1 *)((long)&fp + sVar5 + 7) = 0;
  fprintf(_stderr,"Error: unknown fold definition tag %s%s at line %d\n","LJFOLD",
          (char *)((long)&fname + 6),(ulong)(uint)lineno);
  exit(1);
}

Assistant:

void emit_fold(BuildCtx *ctx)
{
  char buf[256];  /* We don't care about analyzing lines longer than that. */
  const char *fname = ctx->args[0];
  FILE *fp;

  if (fname == NULL) {
    fprintf(stderr, "Error: missing input filename\n");
    exit(1);
  }

  if (fname[0] == '-' && fname[1] == '\0') {
    fp = stdin;
  } else {
    fp = fopen(fname, "r");
    if (!fp) {
      fprintf(stderr, "Error: cannot open input file '%s': %s\n",
	      fname, strerror(errno));
      exit(1);
    }
  }

  fprintf(ctx->fp, "/* This is a generated file. DO NOT EDIT! */\n\n");
  fprintf(ctx->fp, "static const FoldFunc fold_func[] = {\n");

  lineno = 0;
  funcidx = 0;
  nkeys = 0;
  while (fgets(buf, sizeof(buf), fp) != NULL) {
    lineno++;
    /* The prefix must be at the start of a line, otherwise it's ignored. */
    if (!strncmp(buf, FOLDDEF_PREFIX, sizeof(FOLDDEF_PREFIX)-1)) {
      char *p = buf+sizeof(FOLDDEF_PREFIX)-1;
      char *q = strchr(p, ')');
      if (p[0] == '(' && q) {
	p++;
	*q = '\0';
	foldrule(p);
      } else if ((p[0] == 'F' || p[0] == 'X') && p[1] == '(' && q) {
	p += 2;
	*q = '\0';
	if (funcidx)
	  fprintf(ctx->fp, ",\n");
	if (p[-2] == 'X')
	  fprintf(ctx->fp, "  %s", p);
	else
	  fprintf(ctx->fp, "  fold_%s", p);
	funcidx++;
      } else {
	buf[strlen(buf)-1] = '\0';
	fprintf(stderr, "Error: unknown fold definition tag %s%s at line %d\n",
		FOLDDEF_PREFIX, p, lineno);
	exit(1);
      }
    }
  }
  fclose(fp);
  fprintf(ctx->fp, "\n};\n\n");

  makehash(ctx);
}